

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cc
# Opt level: O3

int reschedule_recurring_test(size_t num_threads)

{
  int extraout_EDX;
  int extraout_EDX_00;
  int __how;
  int __fd;
  shared_ptr<simple_thread_pool::TaskHandle> tt;
  size_t count;
  ThreadPoolMgr mgr;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [24];
  size_t local_208;
  undefined8 local_200;
  undefined2 local_1f8;
  ThreadPoolMgr local_1f0;
  string *msg;
  
  local_200._0_1_ = true;
  local_200._1_1_ = false;
  local_200._2_6_ = 0;
  local_1f8._0_1_ = (__atomic_base<bool>)0x0;
  local_1f8._1_1_ = 1;
  local_208 = num_threads;
  simple_thread_pool::ThreadPoolMgr::ThreadPoolMgr(&local_1f0);
  simple_thread_pool::ThreadPoolMgr::init(&local_1f0,(EVP_PKEY_CTX *)&local_208);
  TestSuite::_msgt("begin\n");
  local_240._0_8_ = local_220 + 0x10;
  local_220._16_8_ = 0;
  local_240._8_8_ = 0;
  local_230._8_8_ =
       std::
       _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:237:22)>
       ::_M_invoke;
  local_230._0_8_ =
       std::
       _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:237:22)>
       ::_M_manager;
  simple_thread_pool::ThreadPoolMgr::addTask
            ((ThreadPoolMgr *)local_220,(TaskHandler *)&local_1f0,(uint64_t)local_240,200000);
  if ((code *)local_230._0_8_ != (code *)0x0) {
    (*(code *)local_230._0_8_)(local_240,local_240,3);
  }
  local_240._8_8_ = 0;
  local_230._0_8_ = local_230._0_8_ & 0xffffffffffffff00;
  local_240._0_8_ = local_230;
  TestSuite::sleep_sec(1,(string *)local_240);
  if ((undefined1 *)local_240._0_8_ != local_230) {
    operator_delete((void *)local_240._0_8_);
  }
  simple_thread_pool::TaskHandle::reschedule((TaskHandle *)local_220._0_8_,100000);
  TestSuite::_msgt("rescheduled 200 ms -> 100 ms\n");
  msg = (string *)local_240;
  local_240._8_8_ = 0;
  local_230._0_8_ = local_230._0_8_ & 0xffffffffffffff00;
  local_240._0_8_ = local_230;
  TestSuite::sleep_sec(1,msg);
  __fd = (int)msg;
  __how = extraout_EDX;
  if ((undefined1 *)local_240._0_8_ != local_230) {
    operator_delete((void *)local_240._0_8_);
    __how = extraout_EDX_00;
  }
  simple_thread_pool::ThreadPoolMgr::shutdown(&local_1f0,__fd,__how);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_);
  }
  simple_thread_pool::ThreadPoolMgr::~ThreadPoolMgr(&local_1f0);
  return 0;
}

Assistant:

int reschedule_recurring_test(size_t num_threads) {
    ThreadPoolOptions opt;
    opt.numInitialThreads = num_threads;

    // Initialize thread pool.
    ThreadPoolMgr mgr;
    mgr.init(opt);

    TestSuite::_msgt("begin\n");

    // Register a recurring timer whose interval is 200 ms.
    size_t count = 0;
    std::shared_ptr<TaskHandle> tt =
        mgr.addTask( [&count](const TaskResult& ret) {
                         TestSuite::_msgt("[%02zx] hello world %zu\n",
                                          tid_simple(), count++);
                     },
                     200000,
                     TaskType::RECURRING );
    // Wait 1 second, timer should be fired 5 times.
    TestSuite::sleep_sec(1);

    // Re-schedule the timer, now interval is 100 ms.
    tt->reschedule(100000);
    TestSuite::_msgt("rescheduled 200 ms -> 100 ms\n");

    // Wait another 1 second, timer should be fired 10 times.
    TestSuite::sleep_sec(1);

    // Shutdown thread pool.
    mgr.shutdown();
    return 0;
}